

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_attach(intptr_t uuid,http_settings_s *http_settings,websocket_settings_s *args,
                     void *data,size_t length)

{
  ws_s *owner;
  int *piVar1;
  buffer_s bVar2;
  void *local_58;
  size_t local_50;
  void *local_48;
  size_t local_40;
  ws_s *ws;
  size_t length_local;
  void *data_local;
  websocket_settings_s *args_local;
  http_settings_s *http_settings_local;
  intptr_t uuid_local;
  
  owner = new_websocket(uuid);
  if (owner == (ws_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/websockets.c:333"
                    );
    }
    kill(0,2);
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  bVar2 = create_ws_buffer(owner);
  local_48 = bVar2.data;
  (owner->buffer).data = local_48;
  local_40 = bVar2.size;
  (owner->buffer).size = local_40;
  owner->on_open = args->on_open;
  owner->on_close = args->on_close;
  owner->on_message = args->on_message;
  owner->on_ready = args->on_ready;
  owner->on_shutdown = args->on_shutdown;
  owner->udata = args->udata;
  if (http_settings == (http_settings_s *)0x0) {
    owner->max_msg_size = 0x40000;
    fio_timeout_set(uuid,'(');
  }
  else {
    owner->is_client = http_settings->is_client;
    owner->max_msg_size = http_settings->ws_max_msg_size;
    fio_timeout_set(uuid,http_settings->ws_timeout);
  }
  if ((data != (void *)0x0) && (length != 0)) {
    if ((owner->buffer).size < length) {
      (owner->buffer).size = length;
      bVar2 = resize_ws_buffer(owner,owner->buffer);
      local_58 = bVar2.data;
      (owner->buffer).data = local_58;
      local_50 = bVar2.size;
      (owner->buffer).size = local_50;
      if ((owner->buffer).data == (void *)0x0) {
        fio_attach(uuid,&owner->protocol);
        websocket_close(owner);
        return;
      }
    }
    memcpy((owner->buffer).data,data,length);
    owner->length = length;
  }
  fio_attach(uuid,&owner->protocol);
  fio_force_event(uuid,FIO_EVENT_ON_DATA);
  return;
}

Assistant:

void websocket_attach(intptr_t uuid, http_settings_s *http_settings,
                      websocket_settings_s *args, void *data, size_t length) {
  ws_s *ws = new_websocket(uuid);
  FIO_ASSERT_ALLOC(ws);
  // we have an active websocket connection - prep the connection buffer
  ws->buffer = create_ws_buffer(ws);
  // Setup ws callbacks
  ws->on_open = args->on_open;
  ws->on_close = args->on_close;
  ws->on_message = args->on_message;
  ws->on_ready = args->on_ready;
  ws->on_shutdown = args->on_shutdown;
  // setup any user data
  ws->udata = args->udata;
  if (http_settings) {
    // client mode?
    ws->is_client = http_settings->is_client;
    // buffer limits
    ws->max_msg_size = http_settings->ws_max_msg_size;
    // update the timeout
    fio_timeout_set(uuid, http_settings->ws_timeout);
  } else {
    ws->max_msg_size = (1024 * 256);
    fio_timeout_set(uuid, 40);
  }

  if (data && length) {
    if (length > ws->buffer.size) {
      ws->buffer.size = length;
      ws->buffer = resize_ws_buffer(ws, ws->buffer);
      if (!ws->buffer.data) {
        // no memory.
        fio_attach(uuid, (fio_protocol_s *)ws);
        websocket_close(ws);
        return;
      }
    }
    memcpy(ws->buffer.data, data, length);
    ws->length = length;
  }
  // update the protocol object, cleaning up the old one
  fio_attach(uuid, (fio_protocol_s *)ws);
  // allow the on_open and on_data to take over the control.
  fio_force_event(uuid, FIO_EVENT_ON_DATA);
}